

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
          (ExprHasher *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
          e)

{
  int iVar1;
  size_t seed;
  long lVar2;
  
  seed = (long)*(int *)this + 0x9e3779b9;
  iVar1 = *(int *)(this + 4);
  for (lVar2 = 0; (long)iVar1 * 8 != lVar2; lVar2 = lVar2 + 8) {
    seed = HashCombine<(mp::expr::Kind)48,(mp::expr::Kind)69>
                     (seed,(BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                           *(Impl **)(this + lVar2 + 8));
  }
  return seed;
}

Assistant:

size_t VisitVarArg(E e) {
    size_t hash = Hash(e);
    for (typename E::iterator i = e.begin(), end = e.end(); i != end; ++i)
      hash = HashCombine(hash, *i);
    return hash;
  }